

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::find(StringPiece *this,StringPiece *s,size_type pos)

{
  char *pcVar1;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  size_type xpos;
  const_pointer result;
  size_type local_40;
  char *in_stack_ffffffffffffffd8;
  size_type local_8;
  
  if ((char *)in_RDI[1] < in_RDX) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    pcVar1 = std::search<char_const*,char_const*>
                       ((char *)in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_40 = (long)pcVar1 - *in_RDI;
    if ((ulong)in_RDI[1] < local_40 + *(long *)(in_RSI + 8)) {
      local_40 = 0xffffffffffffffff;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

StringPiece::size_type StringPiece::find(const StringPiece& s,
                                         size_type pos) const {
  if (pos > size_) return npos;
  const_pointer result = std::search(data_ + pos, data_ + size_,
                                     s.data_, s.data_ + s.size_);
  size_type xpos = result - data_;
  return xpos + s.size_ <= size_ ? xpos : npos;
}